

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

llb_build_key_t *
llb_build_key_make_directory_tree_signature(char *path,char **filters,int32_t count_filters)

{
  CAPIBuildKey *this;
  char *pcVar1;
  ulong uVar2;
  StringList *in_R8;
  ulong uVar3;
  StringRef path_00;
  ArrayRef<llvm::StringRef> values;
  BuildKey local_78;
  _Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_58;
  StringList local_40;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)count_filters;
  if (count_filters < 1) {
    uVar3 = uVar2;
  }
  local_58._M_impl.super__Vector_impl_data._M_start = (StringRef *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    local_78.key.key._M_dataplus._M_p = filters[uVar2];
    if (local_78.key.key._M_dataplus._M_p == (char *)0x0) {
      local_78.key.key._M_string_length = 0;
    }
    else {
      local_78.key.key._M_string_length = strlen(local_78.key.key._M_dataplus._M_p);
    }
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_58,
               (StringRef *)&local_78);
  }
  this = (CAPIBuildKey *)operator_new(0x38);
  if (path == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = (char *)strlen(path);
  }
  values.Length =
       (long)local_58._M_impl.super__Vector_impl_data._M_finish -
       (long)local_58._M_impl.super__Vector_impl_data._M_start >> 4;
  values.Data = local_58._M_impl.super__Vector_impl_data._M_start;
  llbuild::basic::StringList::StringList<llvm::StringRef>(&local_40,values);
  path_00.Length = (size_t)&local_40;
  path_00.Data = pcVar1;
  llbuild::buildsystem::BuildKey::makeDirectoryTreeSignature
            (&local_78,(BuildKey *)path,path_00,in_R8);
  anon_unknown.dwarf_243886::CAPIBuildKey::CAPIBuildKey(this,&local_78);
  std::__cxx11::string::_M_dispose();
  llbuild::basic::StringList::~StringList(&local_40);
  std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base(&local_58);
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_directory_tree_signature(const char *_Nonnull path, const char* const* filters, int32_t count_filters) {
  auto filtersToPass = std::vector<StringRef>();
  for (int i = 0; i < count_filters; i++) {
    filtersToPass.push_back(StringRef(filters[i]));
  }
  
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeDirectoryTreeSignature(StringRef(path), basic::StringList(ArrayRef<StringRef>(filtersToPass))));
}